

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payload.hpp
# Opt level: O2

void trackerboy::writePayloadImpl<trackerboy::WaveHandler>
               (Module *mod,OutputBlock *block,WaveHandler *handler)

{
  size_t sVar1;
  size_t i;
  size_t index;
  
  sVar1 = (handler->super_TableHandler<trackerboy::Waveform,_1163280727U>).
          super_PayloadHandler<1163280727U>.mCount;
  for (index = 0; sVar1 != index; index = index + 1) {
    OutputBlock::begin(block,0x45564157);
    WaveHandler::processOut(handler,mod,block,index);
    OutputBlock::finish(block);
  }
  return;
}

Assistant:

void writePayloadImpl(Module const& mod, OutputBlock &block, T& handler) {
    auto const count = handler.count();
    for (size_t i = 0; i < count; ++i) {
        block.begin(handler.id());
        handler.processOut(mod, block, i);
        block.finish();
    }
}